

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

void re2c::output_goto(OutputFile *o,uint32_t ind,bool *readCh,label_t to)

{
  opt_t *poVar1;
  OutputFile *pOVar2;
  string local_48;
  
  if (*readCh == true) {
    poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    InputAPI::stmt_peek_abi_cxx11_(&local_48,&poVar1->input_api,ind);
    OutputFile::wstring(o,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    *readCh = false;
  }
  pOVar2 = OutputFile::wind(o,ind);
  pOVar2 = OutputFile::ws(pOVar2,"goto ");
  poVar1 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
  pOVar2 = OutputFile::wstring(pOVar2,&poVar1->labelPrefix);
  pOVar2 = OutputFile::wlabel(pOVar2,to);
  OutputFile::ws(pOVar2,";\n");
  return;
}

Assistant:

void output_goto (OutputFile & o, uint32_t ind, bool & readCh, label_t to)
{
	if (readCh)
	{
		o.wstring(opts->input_api.stmt_peek (ind));
		readCh = false;
	}
	o.wind(ind).ws("goto ").wstring(opts->labelPrefix).wlabel(to).ws(";\n");
}